

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

int capnp::_::OrphanBuilder::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  uint amount;
  int iVar2;
  void *in_RCX;
  undefined8 in_RDX;
  ulong in_R8;
  word *result;
  AllocateResult AVar3;
  
  *(undefined8 *)(dst + 0x10) = 0;
  *(undefined8 *)(dst + 0x18) = 0;
  *(undefined8 *)dst = 0;
  *(undefined8 *)(dst + 8) = 0;
  if (in_R8 < 0x20000000) {
    amount = (int)in_R8 + 7U >> 3;
    if (src == (EVP_PKEY_CTX *)0x0) {
      iVar2 = ((uint)(_DAT_00000028 - (long)dst >> 1) & 0xfffffffc) - 3;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = _DAT_00000028;
      AVar3 = (AllocateResult)(auVar1 << 0x40);
      _DAT_00000028 = (ulong)amount * 8 + _DAT_00000028;
    }
    else {
      AVar3 = BuilderArena::allocate((BuilderArena *)src,amount);
      iVar2 = -3;
    }
    *(int *)dst = iVar2;
    *(int *)(dst + 4) = (int)in_R8 * 8 + 2;
    if (in_R8 != 0) {
      memcpy(AVar3.words,in_RCX,in_R8);
    }
    *(SegmentBuilder **)(dst + 8) = AVar3.segment;
    *(undefined8 *)(dst + 0x10) = in_RDX;
    *(word **)(dst + 0x18) = AVar3.words;
    return (int)dst;
  }
  ::anon_func::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)dst);
}

Assistant:

OrphanBuilder OrphanBuilder::copy(
    BuilderArena* arena, CapTableBuilder* capTable, Data::Reader copyFrom) {
  OrphanBuilder result;
  auto allocation = WireHelpers::setDataPointer(
      result.tagAsPtr(), nullptr, capTable, copyFrom, arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}